

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O3

void __thiscall wasm::StackIROptimizer::local2Stack(StackIROptimizer *this)

{
  Id IVar1;
  Op OVar2;
  uint setIndex;
  StackInst *inst;
  LocalGet *get;
  long *plVar3;
  LocalGet *pLVar4;
  LocalSet *set;
  _Base_ptr p_Var5;
  uint getIndex;
  pointer pvVar6;
  bool bVar7;
  Index IVar8;
  pointer ppSVar9;
  ulong uVar10;
  Sets *pSVar11;
  SetInfluences *pSVar12;
  _Base_ptr p_Var13;
  LazyLocalGraph *pLVar14;
  LazyLocalGraph *this_00;
  __hash_code __code;
  ulong uVar15;
  uint uVar16;
  undefined1 local_228 [8];
  LazyLocalGraph localGraph;
  unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
  deferredGets;
  undefined1 auStack_78 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  savedValues;
  undefined1 auStack_58 [4];
  Index null;
  iterator iStack_50;
  _Base_ptr local_48;
  uint local_34;
  
  LazyLocalGraph::LazyLocalGraph
            ((LazyLocalGraph *)local_228,this->func,(Module *)0x0,
             (optional<wasm::Expression::Id>)0x0);
  pLVar14 = (LazyLocalGraph *)&localGraph.flower;
  findStringViewDeferredGets
            ((unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
              *)pLVar14,this);
  savedValues.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
  local_48 = (_Base_ptr)0x0;
  _auStack_58 = (Module *)0x0;
  iStack_50._M_current = (uint *)0x0;
  savedValues.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_78 = (undefined1  [8])0x0;
  savedValues.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_34 = 0;
  ppSVar9 = (this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppSVar9) {
    uVar10 = 0;
    do {
      this_00 = (LazyLocalGraph *)auStack_58;
      inst = ppSVar9[uVar10];
      if (inst != (StackInst *)0x0) {
        for (IVar8 = getNumConsumedValues((StackIROptimizer *)pLVar14,inst); IVar8 != 0;
            IVar8 = IVar8 - 1) {
          if ((Module *)iStack_50._M_current == _auStack_58) {
            __assert_fail("values.size() > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                          ,0xb2,"void wasm::StackIROptimizer::local2Stack()");
          }
          while (iStack_50._M_current =
                      (uint *)((long)&(((Module *)((long)iStack_50._M_current + -0x3f0))->tagsMap).
                                      _M_h._M_single_bucket + 4),
                (uint)(((Importable *)&((Module *)iStack_50._M_current)->exports)->super_Named).name
                      .super_IString.str._M_len != 0xffffffff) {
            if ((Module *)iStack_50._M_current == _auStack_58) {
              __assert_fail("values.size() > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                            ,0xb7,"void wasm::StackIROptimizer::local2Stack()");
            }
          }
        }
        OVar2 = inst->op;
        if (OVar2 < (TryTableEnd|BlockBegin)) {
          if ((0x58a4U >> (OVar2 & 0x1f) & 1) == 0) {
            if ((0x214aU >> (OVar2 & 0x1f) & 1) == 0) {
              pvVar6 = savedValues.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (OVar2 == Basic) goto LAB_00cab375;
            }
            else {
              pLVar14 = (LazyLocalGraph *)auStack_78;
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)pLVar14,(value_type *)this_00);
            }
            goto LAB_00cab324;
          }
          if (auStack_78 ==
              (undefined1  [8])
              savedValues.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            __assert_fail("!savedValues.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                          ,0xc4,"void wasm::StackIROptimizer::local2Stack()");
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                     savedValues.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + -1);
          pLVar14 = (LazyLocalGraph *)
                    savedValues.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pvVar6 = savedValues.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + -1;
          if (pLVar14 != (LazyLocalGraph *)0x0) {
            pvVar6 = savedValues.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + -1;
            savedValues.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 savedValues.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1;
            operator_delete(pLVar14,(long)(pvVar6->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)pLVar14);
            pvVar6 = savedValues.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        else {
LAB_00cab324:
          pvVar6 = savedValues.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((Module *)iStack_50._M_current != _auStack_58) {
            iStack_50._M_current = (uint *)_auStack_58;
          }
        }
LAB_00cab375:
        savedValues.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pvVar6;
        getIndex = local_34;
        get = (LocalGet *)inst->origin;
        uVar10 = (inst->type).id;
        IVar1 = (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id;
        if (uVar10 < 2) {
          if (uVar10 == 0 && IVar1 == LocalSetId) {
            if ((_Base_ptr)iStack_50._M_current == local_48) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iStack_50,
                         &local_34);
              pLVar14 = this_00;
            }
            else {
              *iStack_50._M_current = local_34;
              iStack_50._M_current = iStack_50._M_current + 1;
            }
          }
        }
        else {
          if ((IVar1 == LocalGetId) && ((6 < uVar10 & (byte)uVar10) == 0)) {
            plVar3 = *(long **)((long)localGraph.flower._M_t.
                                      super___uniq_ptr_impl<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::LocalGraphFlower_*,_std::default_delete<wasm::LocalGraphFlower>_>
                                      .super__Head_base<0UL,_wasm::LocalGraphFlower_*,_false>.
                                      _M_head_impl +
                               ((ulong)get % (ulong)deferredGets._M_h._M_buckets) * 8);
            pLVar14 = (LazyLocalGraph *)deferredGets._M_h._M_buckets;
            if (plVar3 != (long *)0x0) {
              plVar3 = (long *)*plVar3;
              pLVar4 = (LocalGet *)plVar3[1];
              do {
                if (get == pLVar4) goto LAB_00cab505;
                plVar3 = (long *)*plVar3;
              } while ((plVar3 != (long *)0x0) &&
                      (pLVar4 = (LocalGet *)plVar3[1],
                      (ulong)pLVar4 % (ulong)deferredGets._M_h._M_buckets ==
                      (ulong)get % (ulong)deferredGets._M_h._M_buckets));
            }
            if ((long)iStack_50._M_current - (long)_auStack_58 != 0) {
              uVar10 = (ulong)local_34;
              uVar16 = (uint)((ulong)((long)iStack_50._M_current - (long)_auStack_58) >> 2);
              do {
                uVar16 = uVar16 - 1;
                setIndex = *(uint *)((long)&(((Importable *)&_auStack_58->exports)->super_Named).
                                            name.super_IString.str._M_len + (ulong)uVar16 * 4);
                uVar15 = (ulong)setIndex;
                if (uVar15 == 0xffffffff) break;
                set = (LocalSet *)
                      (this->insts->
                      super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar15]->origin;
                if ((set->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id !=
                    LocalSetId) {
                  __assert_fail("int(_id) == int(T::SpecificId)",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                                ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
                }
                if (set->index == get->index) {
                  pLVar14 = (LazyLocalGraph *)local_228;
                  pSVar11 = LazyLocalGraph::getSets(pLVar14,get);
                  p_Var5 = (_Base_ptr)
                           (pSVar11->
                           super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                           ).flexible._M_t._M_impl.super__Rb_tree_header._M_node_count;
                  p_Var13 = p_Var5;
                  if (p_Var5 == (_Base_ptr)0x0) {
                    p_Var13 = (_Base_ptr)
                              (pSVar11->
                              super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                              ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
                  }
                  if (p_Var13 == (_Base_ptr)0x1) {
                    p_Var13 = p_Var5;
                    if (p_Var5 != (_Base_ptr)0x0) {
                      p_Var13 = (pSVar11->
                                super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                                ).flexible._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                    }
                    p_Var13 = p_Var13 + 1;
                    if (p_Var5 == (_Base_ptr)0x0) {
                      p_Var13 = (_Base_ptr)
                                &(pSVar11->
                                 super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                                 ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage;
                    }
                    if (*(LocalSet **)p_Var13 == set) {
                      pLVar14 = (LazyLocalGraph *)local_228;
                      pSVar12 = LazyLocalGraph::getSetInfluences(pLVar14,set);
                      if (((pSVar12->_M_h)._M_element_count == 1) &&
                         (pLVar14 = (LazyLocalGraph *)this,
                         bVar7 = canRemoveSetGetPair(this,setIndex,getIndex), bVar7)) {
                        if ((LocalGet *)(pSVar12->_M_h)._M_before_begin._M_nxt[1]._M_nxt != get) {
                          __assert_fail("*setInfluences.begin() == get",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                                        ,0xeb,"void wasm::StackIROptimizer::local2Stack()");
                        }
                        (this->insts->
                        super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar15] = (StackInst *)0x0;
                        (this->insts->
                        super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar10] = (StackInst *)0x0;
                        *(uint *)((long)&(((Importable *)&_auStack_58->exports)->super_Named).name.
                                         super_IString.str._M_len + (ulong)uVar16 * 4) = 0xffffffff;
                        goto LAB_00cab53e;
                      }
                    }
                  }
                }
              } while (uVar16 != 0);
            }
          }
LAB_00cab505:
          if ((_Base_ptr)iStack_50._M_current == local_48) {
            pLVar14 = (LazyLocalGraph *)auStack_58;
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)pLVar14,iStack_50,
                       (uint *)((long)&savedValues.
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          }
          else {
            *iStack_50._M_current =
                 savedValues.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            iStack_50._M_current = iStack_50._M_current + 1;
          }
        }
      }
LAB_00cab53e:
      local_34 = local_34 + 1;
      uVar10 = (ulong)local_34;
      ppSVar9 = (this->insts->
                super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->insts->
                                    super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar9 >> 3
                             ));
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)auStack_78);
  if (_auStack_58 != (Module *)0x0) {
    operator_delete(_auStack_58,(long)local_48 - (long)_auStack_58);
  }
  std::
  _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&localGraph.flower);
  LazyLocalGraph::~LazyLocalGraph((LazyLocalGraph *)local_228);
  return;
}

Assistant:

void StackIROptimizer::local2Stack() {
  // We use the localGraph to tell us if a get-set pair is indeed a set that is
  // read by that get, and only that get. Note that we run this on Binaryen IR,
  // so we are assuming that no previous opt has changed the interaction of
  // local operations.
  //
  // We use a lazy graph here as we only query in the rare case when we find a
  // set/get pair that looks optimizable.
  LazyLocalGraph localGraph(func);
  // The binary writing of StringWTF16Get and StringSliceWTF is optimized to use
  // fewer scratch locals when their operands are already LocalGets. To avoid
  // interfering with that optimization, we have to avoid removing such
  // LocalGets.
  auto deferredGets = findStringViewDeferredGets();

  // We maintain a stack of relevant values. This contains:
  //  * a null for each actual value that the value stack would have
  //  * an index of each LocalSet that *could* be on the value
  //    stack at that location.
  const Index null = -1;
  std::vector<Index> values;
  // We also maintain a stack of values vectors for control flow,
  // saving the stack as we enter and restoring it when we exit.
  std::vector<std::vector<Index>> savedValues;
#ifdef STACK_OPT_DEBUG
  std::cout << "func: " << func->name << '\n' << insts << '\n';
#endif
  for (Index instIndex = 0; instIndex < insts.size(); instIndex++) {
    auto* inst = insts[instIndex];
    if (!inst) {
      continue;
    }
    // First, consume values from the stack as required.
    auto consumed = getNumConsumedValues(inst);
#ifdef STACK_OPT_DEBUG
    std::cout << "  " << instIndex << " : " << *inst << ", " << values.size()
              << " on stack, will consume " << consumed << "\n    ";
    for (auto s : values)
      std::cout << s << ' ';
    std::cout << '\n';
#endif
    // TODO: currently we run dce before this, but if we didn't, we'd need
    //       to handle unreachable code here - it's ok to pop multiple values
    //       there even if the stack is at size 0.
    while (consumed > 0) {
      assert(values.size() > 0);
      // Whenever we hit a possible stack value, kill it - it would
      // be consumed here, so we can never optimize to it.
      while (values.back() != null) {
        values.pop_back();
        assert(values.size() > 0);
      }
      // Finally, consume the actual value that is consumed here.
      values.pop_back();
      consumed--;
    }
    // After consuming, we can see what to do with this. First, handle
    // control flow.
    if (isControlFlowBegin(inst)) {
      // Save the stack for when we end this control flow.
      savedValues.push_back(values); // TODO: optimize copies
      values.clear();
    } else if (isControlFlowEnd(inst)) {
      assert(!savedValues.empty());
      values = savedValues.back();
      savedValues.pop_back();
    } else if (isControlFlow(inst)) {
      // Otherwise, in the middle of control flow, just clear it
      values.clear();
    }
    // This is something we should handle, look into it.
    if (inst->type.isConcrete()) {
      bool optimized = false;
      // Do not optimize multivalue locals, since those will be better
      // optimized when they are visited in the binary writer and this
      // optimization would intefere with that one.
      if (auto* get = inst->origin->dynCast<LocalGet>();
          get && inst->type.isSingle() && !deferredGets.count(get)) {
        // Use another local to clarify what instIndex means in this scope.
        auto getIndex = instIndex;

        // This is a potential optimization opportunity! See if we
        // can reach the set.
        if (values.size() > 0) {
          Index j = values.size() - 1;
          while (1) {
            // If there's an actual value in the way, we've failed.
            auto setIndex = values[j];
            if (setIndex == null) {
              break;
            }
            auto* set = insts[setIndex]->origin->cast<LocalSet>();
            if (set->index == get->index) {
              // This might be a proper set-get pair, where the set is
              // used by this get and nothing else, check that.
              auto& sets = localGraph.getSets(get);
              if (sets.size() == 1 && *sets.begin() == set) {
                auto& setInfluences = localGraph.getSetInfluences(set);
                // If this has the proper value of 1, also do the potentially-
                // expensive check of whether we can remove this pair at all.
                if (setInfluences.size() == 1 &&
                    canRemoveSetGetPair(setIndex, getIndex)) {
                  assert(*setInfluences.begin() == get);
                  // Do it! The set and the get can go away, the proper
                  // value is on the stack.
#ifdef STACK_OPT_DEBUG
                  std::cout << "  stackify the get\n";
#endif
                  insts[setIndex] = nullptr;
                  insts[getIndex] = nullptr;
                  // Continuing on from here, replace this on the stack
                  // with a null, representing a regular value. We
                  // keep possible values above us active - they may
                  // be optimized later, as they would be pushed after
                  // us, and used before us, so there is no conflict.
                  values[j] = null;
                  optimized = true;
                  break;
                }
              }
            }
            // We failed here. Can we look some more?
            if (j == 0) {
              break;
            }
            j--;
          }
        }
      }
      if (!optimized) {
        // This is an actual regular value on the value stack.
        values.push_back(null);
      }
    } else if (inst->origin->is<LocalSet>() && inst->type == Type::none) {
      // This set is potentially optimizable later, add to stack.
      values.push_back(instIndex);
    }
  }
}